

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  float *pfVar1;
  ulong uVar2;
  float *pfVar3;
  int n;
  ulong uVar4;
  size_t count_00;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  if (count == 1) {
    if (0.0 <= items->Width) {
      fVar6 = items->Width - width_excess;
      if (fVar6 <= 1.0) {
        fVar6 = 1.0;
      }
      items->Width = fVar6;
    }
  }
  else {
    count_00 = (size_t)count;
    ImQsort(items,count_00,0xc,ShrinkWidthItemComparer);
    pfVar1 = &items->Width;
    uVar2 = 1;
    for (; ((int)uVar2 < count && (0.0 < width_excess)); width_excess = width_excess - fVar7 * fVar8
        ) {
      uVar2 = (ulong)(int)uVar2;
      pfVar3 = pfVar1 + uVar2 * 3;
      for (; (long)uVar2 < (long)count_00; uVar2 = uVar2 + 1) {
        fVar6 = items->Width;
        fVar7 = *pfVar3;
        if (fVar7 < fVar6) {
          if (fVar7 < 0.0) goto LAB_001eba00;
          fVar6 = fVar6 - fVar7;
          goto LAB_001eba0a;
        }
        pfVar3 = pfVar3 + 3;
      }
      fVar6 = items->Width;
LAB_001eba00:
      fVar6 = fVar6 + -1.0;
LAB_001eba0a:
      if (fVar6 <= 0.0) break;
      fVar8 = (float)(int)uVar2;
      fVar7 = width_excess / fVar8;
      if (fVar6 <= fVar7) {
        fVar7 = fVar6;
      }
      uVar4 = 0;
      if (0 < (int)uVar2) {
        uVar4 = uVar2 & 0xffffffff;
      }
      for (lVar5 = 0; uVar4 * 0xc - lVar5 != 0; lVar5 = lVar5 + 0xc) {
        *(float *)((long)pfVar1 + lVar5) = *(float *)((long)pfVar1 + lVar5) - fVar7;
      }
    }
    uVar4 = 0;
    uVar2 = (ulong)(uint)count;
    if (count < 1) {
      uVar2 = uVar4;
    }
    fVar6 = 0.0;
    for (; uVar2 * 0xc - uVar4 != 0; uVar4 = uVar4 + 0xc) {
      fVar7 = *(float *)((long)&items->Width + uVar4);
      fVar8 = (float)(int)fVar7;
      fVar6 = fVar6 + (fVar7 - fVar8);
      *(float *)((long)&items->Width + uVar4) = fVar8;
    }
    while (0.0 < fVar6) {
      lVar5 = 0;
      pfVar3 = pfVar1;
      for (; (lVar5 < (long)count_00 && (0.0 < fVar6)); fVar6 = fVar6 - fVar7) {
        fVar7 = pfVar3[1] - *pfVar3;
        if (1.0 <= fVar7) {
          fVar7 = 1.0;
        }
        *pfVar3 = *pfVar3 + fVar7;
        lVar5 = lVar5 + 1;
        pfVar3 = pfVar3 + 3;
      }
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        if (items[0].Width >= 0.0f)
            items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count && items[count_same_width].Width >= 0.0f) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        if (max_width_to_remove_per_item <= 0.0f)
            break;
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    while (width_excess > 0.0f)
        for (int n = 0; n < count && width_excess > 0.0f; n++)
        {
            float width_to_add = ImMin(items[n].InitialWidth - items[n].Width, 1.0f);
            items[n].Width += width_to_add;
            width_excess -= width_to_add;
        }
}